

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_generic_fwclose(mcpl_generic_wfilehandle_t *fh)

{
  if ((FILE *)fh->internal != (FILE *)0x0) {
    fclose((FILE *)fh->internal);
    fh->internal = (void *)0x0;
    fh->current_pos = 0;
    fh->mode = 0;
    return;
  }
  mcpl_error("Error trying to close invalid file handle");
}

Assistant:

void mcpl_generic_fwclose( mcpl_generic_wfilehandle_t* fh )
{
  if ( !fh->internal )
    mcpl_error("Error trying to close invalid file handle");
  fclose( (FILE*)(fh->internal) );
  fh->mode = 0;
  fh->current_pos = 0;
  fh->internal = NULL;
}